

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void init_all_wedge_masks(void)

{
  init_wedge_master_masks();
  init_wedge_masks();
  init_smooth_interintra_masks();
  return;
}

Assistant:

static void init_all_wedge_masks(void) {
  init_wedge_master_masks();
  init_wedge_masks();
  init_smooth_interintra_masks();
}